

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DiskTable.cpp
# Opt level: O3

bool __thiscall DiskTableNode::hasKey(DiskTableNode *this,longlong key)

{
  bool bVar1;
  _Base_ptr p_Var2;
  _Base_ptr p_Var3;
  _Base_ptr p_Var4;
  IndexMap *pIVar5;
  
  pIVar5 = this->index;
  if ((pIVar5 == (IndexMap *)0x0) ||
     ((pIVar5->_M_t)._M_impl.super__Rb_tree_header._M_node_count == 0)) {
    loadIndexFilter(this);
    pIVar5 = this->index;
  }
  bVar1 = mightIn(this,key);
  if (bVar1) {
    p_Var3 = (this->index->_M_t)._M_impl.super__Rb_tree_header._M_header._M_parent;
    p_Var2 = &(this->index->_M_t)._M_impl.super__Rb_tree_header._M_header;
    p_Var4 = p_Var2;
    if (p_Var3 != (_Base_ptr)0x0) {
      do {
        if (key <= *(long *)(p_Var3 + 1)) {
          p_Var4 = p_Var3;
        }
        p_Var3 = (&p_Var3->_M_left)[*(long *)(p_Var3 + 1) < key];
      } while (p_Var3 != (_Base_ptr)0x0);
      if ((p_Var4 != p_Var2) && (*(long *)(p_Var4 + 1) <= key)) {
        p_Var2 = p_Var4;
      }
    }
    bVar1 = (_Rb_tree_header *)p_Var2 != &(pIVar5->_M_t)._M_impl.super__Rb_tree_header;
  }
  else {
    bVar1 = false;
  }
  return bVar1;
}

Assistant:

bool DiskTableNode::hasKey(long long key) {
    auto *i = getIndex();
    return mightIn(key) && index->find(key) != i->end();
}